

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<arg_res_tuple<double,_2UL>_> *
Catch::Generators::
makeGenerators<arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>>
          (arg_res_tuple<double,_2UL> *val,arg_res_tuple<double,_2UL> *moreGenerators,
          arg_res_tuple<double,_2UL> *moreGenerators_1,arg_res_tuple<double,_2UL> *moreGenerators_2,
          arg_res_tuple<double,_2UL> *moreGenerators_3,arg_res_tuple<double,_2UL> *moreGenerators_4,
          arg_res_tuple<double,_2UL> *moreGenerators_5,arg_res_tuple<double,_2UL> *moreGenerators_6,
          arg_res_tuple<double,_2UL> *moreGenerators_7,arg_res_tuple<double,_2UL> *moreGenerators_8,
          arg_res_tuple<double,_2UL> *moreGenerators_9,arg_res_tuple<double,_2UL> *moreGenerators_10
          ,arg_res_tuple<double,_2UL> *moreGenerators_11)

{
  arg_res_tuple<double,_2UL> *unaff_RBX;
  arg_res_tuple<double,_2UL> *unaff_RBP;
  Generators<arg_res_tuple<double,_2UL>_> *in_RDI;
  arg_res_tuple<double,_2UL> *unaff_R12;
  arg_res_tuple<double,_2UL> *unaff_R13;
  arg_res_tuple<double,_2UL> *unaff_R14;
  arg_res_tuple<double,_2UL> *unaff_R15;
  arg_res_tuple<double,_2UL> *unaff_retaddr;
  arg_res_tuple<double,_2UL> *in_stack_00000008;
  undefined8 in_stack_00000040;
  arg_res_tuple<double,_2UL> local_d8 [2];
  undefined8 local_a0;
  Generators<arg_res_tuple<double,_2UL>_> *moreGenerators_3_00;
  arg_res_tuple<double,_2UL> *moreGenerators_2_00;
  arg_res_tuple<double,_2UL> *in_stack_ffffffffffffff88;
  GeneratorWrapper<arg_res_tuple<double,_2UL>_> *in_stack_ffffffffffffff90;
  arg_res_tuple<double,_2UL> local_68 [2];
  
  moreGenerators_2_00 = local_68;
  moreGenerators_3_00 = in_RDI;
  value<arg_res_tuple<double,2ul>>((arg_res_tuple<double,_2UL> *)in_RDI);
  local_a0 = in_stack_00000040;
  makeGenerators<arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>,arg_res_tuple<double,2ul>>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,local_d8,moreGenerators_2_00,
             (arg_res_tuple<double,_2UL> *)moreGenerators_3_00,unaff_RBX,unaff_R12,unaff_R13,
             unaff_R14,unaff_R15,unaff_RBP,unaff_retaddr,in_stack_00000008);
  GeneratorWrapper<arg_res_tuple<double,_2UL>_>::~GeneratorWrapper
            ((GeneratorWrapper<arg_res_tuple<double,_2UL>_> *)0x3d9241);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }